

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Pooling_x86_avx2::forward(Pooling_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  size_t _elemsize;
  _func_int **pp_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  int i;
  int iVar15;
  uint uVar16;
  _func_int *p_Var17;
  void *pvVar18;
  ulong uVar19;
  void *pvVar20;
  long lVar21;
  int iVar22;
  void *pvVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  Pooling *this_00;
  Mat *this_01;
  int k;
  long lVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  int ki;
  long lVar35;
  void *pvVar36;
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [16];
  int iVar39;
  float *pfVar40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  bool bVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  int local_188;
  void *local_170;
  Mat m;
  Mat bottom_blob_bordered;
  Mat bottom_blob_bordered_1;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  this_00 = (Pooling *)
            ((long)&this->_vptr_Pooling_x86_avx2 + (long)this->_vptr_Pooling_x86_avx2[-3]);
  if (*(int *)(&this->field_0x100 + (long)this->_vptr_Pooling_x86_avx2[-3]) != 0) {
LAB_001d56d6:
    iVar15 = Pooling::forward(this_00,bottom_blob,top_blob,opt);
    return iVar15;
  }
  iVar15 = bottom_blob->w;
  iVar24 = bottom_blob->h;
  uVar16 = bottom_blob->c;
  uVar19 = (ulong)uVar16;
  _elemsize = bottom_blob->elemsize;
  if (bottom_blob->elempack == 4) {
    if (this_00->global_pooling != 0) {
      Mat::create(top_blob,uVar16,_elemsize,4,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar24 = iVar24 * iVar15;
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx2[-3]) == 1) {
        fVar45 = 1.0 / (float)iVar24;
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        if ((int)uVar16 < 1) {
          uVar19 = 0;
        }
        for (uVar43 = 0; uVar43 != uVar19; uVar43 = uVar43 + 1) {
          Mat::channel(&m,bottom_blob,(int)uVar43);
          pfVar40 = (float *)m.data;
          Mat::~Mat(&m);
          fVar53 = 0.0;
          fVar54 = 0.0;
          fVar46 = 0.0;
          fVar52 = 0.0;
          iVar15 = iVar24;
          while (bVar44 = iVar15 != 0, iVar15 = iVar15 + -1, bVar44) {
            fVar53 = fVar53 + *pfVar40;
            fVar54 = fVar54 + pfVar40[1];
            fVar46 = fVar46 + pfVar40[2];
            fVar52 = fVar52 + pfVar40[3];
            pfVar40 = pfVar40 + 4;
          }
          pfVar40 = (float *)((long)top_blob->data + uVar43 * 0x10);
          *pfVar40 = fVar53 * fVar45;
          pfVar40[1] = fVar54 * fVar45;
          pfVar40[2] = fVar46 * fVar45;
          pfVar40[3] = fVar52 * fVar45;
        }
        return 0;
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx2[-3]) != 0) {
        return 0;
      }
      if (iVar24 < 1) {
        iVar24 = 0;
      }
      if ((int)uVar16 < 1) {
        uVar19 = 0;
      }
      for (uVar43 = 0; uVar43 != uVar19; uVar43 = uVar43 + 1) {
        Mat::channel(&m,bottom_blob,(int)uVar43);
        pauVar38 = (undefined1 (*) [16])m.data;
        Mat::~Mat(&m);
        auVar48 = *pauVar38;
        iVar15 = iVar24;
        while (bVar44 = iVar15 != 0, iVar15 = iVar15 + -1, bVar44) {
          auVar48 = vmaxps_avx(auVar48,*pauVar38);
          pauVar38 = pauVar38 + 1;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar43 * 0x10) = auVar48;
      }
      return 0;
    }
    bottom_blob_bordered_1.cstep = 0;
    bottom_blob_bordered_1.data = (void *)0x0;
    bottom_blob_bordered_1.refcount._0_4_ = 0;
    bottom_blob_bordered_1.refcount._4_4_ = 0;
    bottom_blob_bordered_1._16_12_ = SUB1612(ZEXT816(0),4);
    bottom_blob_bordered_1._32_12_ = SUB1612(ZEXT816(0),0);
    bottom_blob_bordered_1.h = 0;
    bottom_blob_bordered_1.d = 0;
    bottom_blob_bordered_1.c = 0;
    bottom_blob_bordered_1.w = bottom_blob_bordered_1.refcount._4_4_;
    Pooling::make_padding(this_00,bottom_blob,&bottom_blob_bordered_1,opt);
    iVar22 = bottom_blob_bordered_1.h;
    iVar24 = bottom_blob_bordered_1.w;
    iVar15 = -100;
    if ((bottom_blob_bordered_1.data != (void *)0x0) &&
       ((long)bottom_blob_bordered_1.c * bottom_blob_bordered_1.cstep != 0)) {
      p_Var17 = this->_vptr_Pooling_x86_avx2[-3];
      iVar39 = (bottom_blob_bordered_1.w - *(int *)(&this->field_0xd4 + (long)p_Var17)) /
               *(int *)(&this->field_0xdc + (long)p_Var17);
      iVar28 = (bottom_blob_bordered_1.h - *(int *)(&this->field_0xd8 + (long)p_Var17)) /
               *(int *)(&this->field_0xe0 + (long)p_Var17);
      iVar26 = iVar39 + 1;
      Mat::create(top_blob,iVar26,iVar28 + 1,uVar16,_elemsize,4,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar43 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86_avx2[-3]) *
                 (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86_avx2[-3]);
        std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar43,(allocator_type *)&m);
        pp_Var4 = this->_vptr_Pooling_x86_avx2;
        p_Var17 = pp_Var4[-3];
        iVar15 = *(int *)(&this->field_0xd4 + (long)p_Var17);
        lVar31 = 0;
        iVar27 = 0;
        for (iVar30 = 0; iVar33 = *(int *)(&this->field_0xd8 + (long)p_Var17), iVar30 < iVar33;
            iVar30 = iVar30 + 1) {
          for (lVar34 = 0; iVar33 = (int)lVar34,
              iVar33 < *(int *)(&this->field_0xd4 + (long)p_Var17); lVar34 = lVar34 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar31 + lVar34] = iVar27 + iVar33;
            p_Var17 = pp_Var4[-3];
          }
          iVar27 = iVar27 + (iVar24 - iVar15) + iVar33;
          lVar31 = (int)lVar31 + lVar34;
        }
        lVar31 = (long)iVar39;
        iVar15 = (int)uVar43;
        if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 0) {
          if (iVar33 == 2 && *(int *)(&this->field_0xd4 + (long)p_Var17) == 2) {
            if ((*(int *)(&this->field_0xdc + (long)p_Var17) == 2) &&
               (*(int *)(&this->field_0xe0 + (long)p_Var17) == 2)) {
              iVar15 = top_blob->w;
              iVar24 = bottom_blob_bordered_1.w - iVar15;
              iVar22 = 0;
              if (iVar15 < 1) {
                iVar15 = iVar22;
              }
              iVar39 = top_blob->h;
              if (top_blob->h < 1) {
                iVar39 = iVar22;
              }
              iVar28 = bottom_blob_bordered_1.c;
              if (bottom_blob_bordered_1.c < 1) {
                iVar28 = iVar22;
              }
              for (; iVar22 != iVar28; iVar22 = iVar22 + 1) {
                Mat::channel(&m,&bottom_blob_bordered_1,iVar22);
                Mat::channel(&bottom_blob_bordered,top_blob,iVar22);
                pvVar36 = bottom_blob_bordered.data;
                Mat::~Mat(&bottom_blob_bordered);
                pvVar20 = (void *)((long)m.w * m.elemsize + (long)m.data);
                pvVar18 = m.data;
                for (iVar26 = 0; iVar26 != iVar39; iVar26 = iVar26 + 1) {
                  lVar34 = 0;
                  lVar31 = (long)(iVar24 * 8) * -4;
                  iVar27 = iVar15;
                  while (bVar44 = iVar27 != 0, iVar27 = iVar27 + -1, bVar44) {
                    auVar48 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar18 + lVar34 * 2),
                                         *(undefined1 (*) [16])((long)pvVar18 + lVar34 * 2 + 0x10));
                    auVar47 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar20 + lVar34 * 2),
                                         *(undefined1 (*) [16])((long)pvVar20 + lVar34 * 2 + 0x10));
                    auVar48 = vmaxps_avx(auVar48,auVar47);
                    *(undefined1 (*) [16])((long)pvVar36 + lVar34) = auVar48;
                    lVar31 = lVar31 + -0x20;
                    lVar34 = lVar34 + 0x10;
                  }
                  pvVar18 = (void *)((long)pvVar18 - lVar31);
                  pvVar20 = (void *)((long)pvVar20 - lVar31);
                  pvVar36 = (void *)((long)pvVar36 + lVar34);
                }
                Mat::~Mat(&m);
              }
            }
            else {
LAB_001d6c3e:
              uVar32 = 0;
              uVar43 = uVar43 & 0xffffffff;
              if (iVar15 < 1) {
                uVar43 = uVar32;
              }
              if ((int)uVar16 < 1) {
                uVar19 = uVar32;
              }
              while( true ) {
                local_188 = (int)uVar19;
                iVar15 = (int)uVar32;
                if (iVar15 == local_188) break;
                Mat::channel(&m,&bottom_blob_bordered_1,iVar15);
                Mat::channel(&bottom_blob_bordered,top_blob,iVar15);
                pvVar36 = bottom_blob_bordered.data;
                Mat::~Mat(&bottom_blob_bordered);
                for (iVar24 = 0; iVar24 <= iVar28; iVar24 = iVar24 + 1) {
                  pp_Var4 = this->_vptr_Pooling_x86_avx2;
                  for (lVar34 = 0; lVar34 <= lVar31; lVar34 = lVar34 + 1) {
                    pauVar38 = (undefined1 (*) [16])
                               ((long)m.data +
                               (long)(*(int *)(&this->field_0xdc + (long)pp_Var4[-3]) * (int)lVar34
                                     * 4) * 4 +
                               (long)m.w * (long)iVar24 *
                               (long)*(int *)(&this->field_0xe0 + (long)pp_Var4[-3]) * m.elemsize);
                    auVar48 = *pauVar38;
                    for (uVar32 = 0; uVar43 != uVar32; uVar32 = uVar32 + 1) {
                      auVar48 = vmaxps_avx(auVar48,pauVar38[_space_ofs.
                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar32]])
                      ;
                    }
                    *(undefined1 (*) [16])((long)pvVar36 + lVar34 * 0x10) = auVar48;
                  }
                  pvVar36 = (void *)((long)pvVar36 + (long)(iVar26 * 4) * 4);
                }
                Mat::~Mat(&m);
                uVar32 = (ulong)(iVar15 + 1);
              }
            }
          }
          else {
            if (((iVar33 != 3 || *(int *)(&this->field_0xd4 + (long)p_Var17) != 3) ||
                (*(int *)(&this->field_0xdc + (long)p_Var17) != 2)) ||
               (*(int *)(&this->field_0xe0 + (long)p_Var17) != 2)) goto LAB_001d6c3e;
            iVar15 = top_blob->w;
            iVar24 = top_blob->h;
            iVar22 = 0;
            if (iVar24 < 1) {
              iVar24 = 0;
            }
            iVar39 = bottom_blob_bordered_1.c;
            if (bottom_blob_bordered_1.c < 1) {
              iVar39 = 0;
            }
            lVar31 = (long)((bottom_blob_bordered_1.w - iVar15) * 8) * 4;
            for (; iVar22 != iVar39; iVar22 = iVar22 + 1) {
              Mat::channel(&m,&bottom_blob_bordered_1,iVar22);
              Mat::channel(&bottom_blob_bordered,top_blob,iVar22);
              pauVar38 = (undefined1 (*) [16])bottom_blob_bordered.data;
              Mat::~Mat(&bottom_blob_bordered);
              pvVar36 = (void *)((long)m.data + (long)m.w * m.elemsize);
              pvVar18 = (void *)((long)m.data + (long)m.w * m.elemsize * 2);
              pvVar20 = m.data;
              for (iVar28 = 0; iVar28 != iVar24; iVar28 = iVar28 + 1) {
                lVar34 = 0;
                for (iVar26 = 0; iVar26 + 1 < iVar15; iVar26 = iVar26 + 2) {
                  auVar48 = *(undefined1 (*) [16])((long)pvVar36 + lVar34 + 0x20);
                  auVar47 = *(undefined1 (*) [16])((long)pvVar18 + lVar34 + 0x20);
                  auVar1 = *(undefined1 (*) [16])((long)pvVar20 + lVar34 + 0x20);
                  auVar5 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar20 + lVar34),
                                      *(undefined1 (*) [16])((long)pvVar20 + lVar34 + 0x10));
                  auVar5 = vmaxps_avx(auVar5,auVar1);
                  auVar5 = vmaxps_avx(auVar5,*(undefined1 (*) [16])((long)pvVar36 + lVar34));
                  auVar5 = vmaxps_avx(auVar5,*(undefined1 (*) [16])((long)pvVar36 + lVar34 + 0x10));
                  auVar6 = vmaxps_avx(auVar48,*(undefined1 (*) [16])((long)pvVar18 + lVar34));
                  auVar6 = vmaxps_avx(auVar6,*(undefined1 (*) [16])((long)pvVar18 + lVar34 + 0x10));
                  auVar6 = vmaxps_avx(auVar6,auVar47);
                  auVar7 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar20 + lVar34 + 0x30),
                                      *(undefined1 (*) [16])((long)pvVar20 + lVar34 + 0x40));
                  auVar1 = vmaxps_avx(auVar7,auVar1);
                  auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [16])((long)pvVar36 + lVar34 + 0x30));
                  auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [16])((long)pvVar36 + lVar34 + 0x40));
                  auVar48 = vmaxps_avx(auVar48,*(undefined1 (*) [16])((long)pvVar18 + lVar34 + 0x30)
                                      );
                  auVar1 = vmaxps_avx(auVar1,*(undefined1 (*) [16])((long)pvVar18 + lVar34 + 0x40));
                  auVar5 = vmaxps_avx(auVar5,auVar6);
                  *pauVar38 = auVar5;
                  auVar48 = vmaxps_avx(auVar47,auVar48);
                  auVar48 = vmaxps_avx(auVar1,auVar48);
                  pauVar38[1] = auVar48;
                  pauVar38 = pauVar38 + 2;
                  lVar34 = lVar34 + 0x40;
                }
                for (; iVar26 < iVar15; iVar26 = iVar26 + 1) {
                  auVar48 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar20 + lVar34),
                                       *(undefined1 (*) [16])((long)pvVar20 + lVar34 + 0x10));
                  auVar48 = vmaxps_avx(auVar48,*(undefined1 (*) [16])((long)pvVar20 + lVar34 + 0x20)
                                      );
                  auVar48 = vmaxps_avx(auVar48,*(undefined1 (*) [16])((long)pvVar36 + lVar34));
                  auVar48 = vmaxps_avx(auVar48,*(undefined1 (*) [16])((long)pvVar36 + lVar34 + 0x10)
                                      );
                  auVar47 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar36 + lVar34 + 0x20),
                                       *(undefined1 (*) [16])((long)pvVar18 + lVar34));
                  auVar47 = vmaxps_avx(auVar47,*(undefined1 (*) [16])((long)pvVar18 + lVar34 + 0x10)
                                      );
                  auVar47 = vmaxps_avx(auVar47,*(undefined1 (*) [16])((long)pvVar18 + lVar34 + 0x20)
                                      );
                  auVar48 = vmaxps_avx(auVar48,auVar47);
                  *pauVar38 = auVar48;
                  pauVar38 = pauVar38 + 1;
                  lVar34 = lVar34 + 0x20;
                }
                pvVar20 = (void *)((long)pvVar20 + lVar34 + lVar31);
                pvVar36 = (void *)((long)pvVar36 + lVar34 + lVar31);
                pvVar18 = (void *)((long)pvVar18 + lVar34 + lVar31);
              }
              Mat::~Mat(&m);
            }
          }
        }
        else if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 1) {
          if (*(int *)(&this->field_0xfc + (long)p_Var17) == 0) {
            iVar15 = 0;
            iVar39 = 0;
            if (*(int *)(&this->field_0xf8 + (long)p_Var17) == 0) {
              iVar15 = (bottom_blob->w - bottom_blob_bordered_1.w) +
                       *(int *)(&this->field_0xe4 + (long)p_Var17) +
                       *(int *)(&this->field_0xe8 + (long)p_Var17);
              iVar39 = (bottom_blob->h - bottom_blob_bordered_1.h) +
                       *(int *)(&this->field_0xec + (long)p_Var17) +
                       *(int *)(&this->field_0xf0 + (long)p_Var17);
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar41 = 0; uVar41 != uVar16; uVar41 = uVar41 + 1) {
              Mat::channel(&m,&bottom_blob_bordered_1,uVar41);
              Mat::channel(&bottom_blob_bordered,top_blob,uVar41);
              local_170 = bottom_blob_bordered.data;
              Mat::~Mat(&bottom_blob_bordered);
              pp_Var4 = this->_vptr_Pooling_x86_avx2;
              for (iVar27 = 0; iVar27 <= iVar28; iVar27 = iVar27 + 1) {
                lVar34 = (long)(*(int *)(&this->field_0xe0 + (long)pp_Var4[-3]) * iVar27);
                for (lVar29 = 0; lVar29 <= lVar31; lVar29 = lVar29 + 1) {
                  p_Var17 = pp_Var4[-3];
                  uVar43 = 0;
                  uVar19 = (ulong)*(uint *)(&this->field_0xd8 + (long)p_Var17);
                  if ((int)*(uint *)(&this->field_0xd8 + (long)p_Var17) < 1) {
                    uVar19 = uVar43;
                  }
                  lVar25 = (long)(*(int *)(&this->field_0xdc + (long)p_Var17) * (int)lVar29);
                  lVar35 = lVar25 * 0x10 + (long)m.w * m.elemsize * lVar34 + (long)m.data;
                  fVar45 = 0.0;
                  fVar53 = 0.0;
                  fVar54 = 0.0;
                  fVar46 = 0.0;
                  iVar30 = 0;
                  for (; uVar43 != uVar19; uVar43 = uVar43 + 1) {
                    lVar21 = uVar43 + lVar34;
                    if (*(int *)(&this->field_0xec + (long)p_Var17) <= lVar21) {
                      if ((iVar39 + iVar22) - *(int *)(&this->field_0xf0 + (long)p_Var17) <= lVar21)
                      break;
                      uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var17);
                      if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var17) < 1) {
                        uVar14 = 0;
                      }
                      lVar21 = lVar25;
                      for (lVar42 = 0; (ulong)uVar14 * 0x10 != lVar42; lVar42 = lVar42 + 0x10) {
                        if (*(int *)(&this->field_0xe4 + (long)p_Var17) <= lVar21) {
                          if ((iVar15 + iVar24) - *(int *)(&this->field_0xe8 + (long)p_Var17) <=
                              lVar21) break;
                          pfVar40 = (float *)(lVar35 + lVar42);
                          fVar54 = fVar54 + *pfVar40;
                          fVar46 = fVar46 + pfVar40[1];
                          fVar45 = fVar45 + pfVar40[2];
                          fVar53 = fVar53 + pfVar40[3];
                          iVar30 = iVar30 + 1;
                        }
                        lVar21 = lVar21 + 1;
                      }
                    }
                    lVar35 = lVar35 + (long)m.w * m.elemsize;
                  }
                  fVar52 = 1.0 / (float)iVar30;
                  auVar48._0_4_ = fVar52 * fVar54;
                  auVar48._4_4_ = fVar52 * fVar46;
                  auVar48._8_4_ = fVar52 * fVar45;
                  auVar48._12_4_ = fVar52 * fVar53;
                  *(undefined1 (*) [16])((long)local_170 + lVar29 * 0x10) = auVar48;
                }
                local_170 = (void *)((long)local_170 + (long)(iVar26 * 4) * 4);
              }
              Mat::~Mat(&m);
            }
          }
          else {
            fVar45 = 1.0 / (float)iVar15;
            uVar32 = 0;
            uVar43 = uVar43 & 0xffffffff;
            if (iVar15 < 1) {
              uVar43 = uVar32;
            }
            if ((int)uVar16 < 1) {
              uVar19 = uVar32;
            }
            while( true ) {
              local_188 = (int)uVar19;
              iVar15 = (int)uVar32;
              if (iVar15 == local_188) break;
              Mat::channel(&m,&bottom_blob_bordered_1,iVar15);
              Mat::channel(&bottom_blob_bordered,top_blob,iVar15);
              pvVar36 = bottom_blob_bordered.data;
              Mat::~Mat(&bottom_blob_bordered);
              for (iVar24 = 0; iVar24 <= iVar28; iVar24 = iVar24 + 1) {
                pp_Var4 = this->_vptr_Pooling_x86_avx2;
                for (lVar34 = 0; lVar34 <= lVar31; lVar34 = lVar34 + 1) {
                  fVar53 = 0.0;
                  fVar54 = 0.0;
                  fVar46 = 0.0;
                  fVar52 = 0.0;
                  for (uVar32 = 0; uVar43 != uVar32; uVar32 = uVar32 + 1) {
                    pfVar40 = (float *)((long)m.data +
                                       (long)_space_ofs.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[uVar32] * 0x10 +
                                       (long)(*(int *)(&this->field_0xdc + (long)pp_Var4[-3]) *
                                              (int)lVar34 * 4) * 4 +
                                       (long)m.w * (long)iVar24 *
                                       (long)*(int *)(&this->field_0xe0 + (long)pp_Var4[-3]) *
                                       m.elemsize);
                    fVar53 = fVar53 + *pfVar40;
                    fVar54 = fVar54 + pfVar40[1];
                    fVar46 = fVar46 + pfVar40[2];
                    fVar52 = fVar52 + pfVar40[3];
                  }
                  auVar47._0_4_ = fVar53 * fVar45;
                  auVar47._4_4_ = fVar54 * fVar45;
                  auVar47._8_4_ = fVar46 * fVar45;
                  auVar47._12_4_ = fVar52 * fVar45;
                  *(undefined1 (*) [16])((long)pvVar36 + lVar34 * 0x10) = auVar47;
                }
                pvVar36 = (void *)((long)pvVar36 + (long)(iVar26 * 4) * 4);
              }
              Mat::~Mat(&m);
              uVar32 = (ulong)(iVar15 + 1);
            }
          }
        }
LAB_001d7242:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
        iVar15 = 0;
      }
    }
  }
  else {
    if (bottom_blob->elempack != 8) {
      if (((this_00->kernel_w != this_00->kernel_h) || (this_00->stride_w != this_00->stride_h)) ||
         ((this_00->stride_w != 2 ||
          (((this_00->pooling_type != 0 || (this_00->global_pooling == 1)) ||
           (this_00->kernel_w != 2)))))) goto LAB_001d56d6;
      bottom_blob_bordered.cstep = 0;
      bottom_blob_bordered.data = (void *)0x0;
      bottom_blob_bordered.refcount._0_4_ = 0;
      bottom_blob_bordered.refcount._4_4_ = 0;
      bottom_blob_bordered._16_12_ = SUB1612(ZEXT816(0),4);
      bottom_blob_bordered._32_12_ = SUB1612(ZEXT816(0),0);
      bottom_blob_bordered.h = 0;
      bottom_blob_bordered.d = 0;
      bottom_blob_bordered.c = 0;
      bottom_blob_bordered.w = bottom_blob_bordered.refcount._4_4_;
      Pooling::make_padding(this_00,bottom_blob,&bottom_blob_bordered,opt);
      iVar15 = -100;
      if ((bottom_blob_bordered.data != (void *)0x0) &&
         ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
        p_Var17 = this->_vptr_Pooling_x86_avx2[-3];
        Mat::create(top_blob,(bottom_blob_bordered.w - *(int *)(&this->field_0xd4 + (long)p_Var17))
                             / *(int *)(&this->field_0xdc + (long)p_Var17) + 1,
                    (bottom_blob_bordered.h - *(int *)(&this->field_0xd8 + (long)p_Var17)) /
                    *(int *)(&this->field_0xe0 + (long)p_Var17) + 1,uVar16,_elemsize,
                    opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          lVar31 = (long)bottom_blob_bordered.w;
          uVar16 = top_blob->w;
          iVar24 = top_blob->h;
          if (top_blob->h < 1) {
            iVar24 = 0;
          }
          iVar15 = 0;
          iVar22 = bottom_blob_bordered.c;
          if (bottom_blob_bordered.c < 1) {
            iVar22 = 0;
          }
          lVar34 = (long)(int)((bottom_blob_bordered.w - uVar16) * 2) * 4;
          for (iVar39 = 0; iVar39 != iVar22; iVar39 = iVar39 + 1) {
            Mat::channel(&m,&bottom_blob_bordered,iVar39);
            pvVar18 = m.data;
            Mat::~Mat(&m);
            Mat::channel(&m,top_blob,iVar39);
            pvVar20 = m.data;
            Mat::~Mat(&m);
            pvVar36 = (void *)((long)pvVar18 + lVar31 * 4);
            for (iVar28 = 0; iVar28 != iVar24; iVar28 = iVar28 + 1) {
              lVar29 = 0;
              lVar25 = 0;
              pvVar23 = pvVar20;
              for (iVar26 = (int)uVar16 >> 2; 0 < iVar26; iVar26 = iVar26 + -1) {
                auVar2 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar18 + lVar25 * 8),
                                    *(undefined1 (*) [32])((long)pvVar36 + lVar25 * 8));
                auVar2 = vshufps_avx(auVar2,auVar2,0xd8);
                auVar2 = vpermpd_avx2(auVar2,0xd8);
                auVar48 = vmaxps_avx(auVar2._0_16_,auVar2._16_16_);
                *(undefined1 (*) [16])((long)pvVar20 + lVar25 * 4) = auVar48;
                pvVar23 = (void *)((long)pvVar23 + 0x10);
                lVar25 = lVar25 + 4;
                lVar29 = lVar29 + 0x20;
              }
              for (lVar25 = 0; (uVar16 & 3) << 2 != (int)lVar25; lVar25 = lVar25 + 4) {
                auVar48 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar18 + lVar29 + 4)),
                                     ZEXT416(*(uint *)((long)pvVar18 + lVar29)));
                auVar47 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar36 + lVar29 + 4)),
                                     ZEXT416(*(uint *)((long)pvVar36 + lVar29)));
                auVar48 = vmaxss_avx(auVar47,auVar48);
                *(int *)((long)pvVar23 + lVar25) = auVar48._0_4_;
                lVar29 = lVar29 + 8;
              }
              pvVar18 = (void *)((long)pvVar18 + lVar29 + lVar34);
              pvVar36 = (void *)((long)pvVar36 + lVar29 + lVar34);
              pvVar20 = (void *)((long)pvVar23 + lVar25);
            }
          }
        }
      }
      this_01 = &bottom_blob_bordered;
      goto LAB_001d7262;
    }
    if (this_00->global_pooling != 0) {
      Mat::create(top_blob,uVar16,_elemsize,8,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar24 = iVar24 * iVar15;
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx2[-3]) == 1) {
        fVar45 = 1.0 / (float)iVar24;
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        if ((int)uVar16 < 1) {
          uVar19 = 0;
        }
        for (uVar43 = 0; uVar43 != uVar19; uVar43 = uVar43 + 1) {
          Mat::channel(&m,bottom_blob,(int)uVar43);
          pfVar40 = (float *)m.data;
          Mat::~Mat(&m);
          fVar53 = 0.0;
          fVar54 = 0.0;
          fVar46 = 0.0;
          fVar52 = 0.0;
          fVar55 = 0.0;
          fVar56 = 0.0;
          fVar57 = 0.0;
          fVar58 = 0.0;
          iVar15 = iVar24;
          while (bVar44 = iVar15 != 0, iVar15 = iVar15 + -1, bVar44) {
            fVar46 = fVar46 + *pfVar40;
            fVar52 = fVar52 + pfVar40[1];
            fVar53 = fVar53 + pfVar40[2];
            fVar54 = fVar54 + pfVar40[3];
            fVar55 = fVar55 + pfVar40[4];
            fVar56 = fVar56 + pfVar40[5];
            fVar57 = fVar57 + pfVar40[6];
            fVar58 = fVar58 + pfVar40[7];
            pfVar40 = pfVar40 + 8;
          }
          pfVar40 = (float *)((long)top_blob->data + uVar43 * 0x20);
          *pfVar40 = fVar46 * fVar45;
          pfVar40[1] = fVar52 * fVar45;
          pfVar40[2] = fVar53 * fVar45;
          pfVar40[3] = fVar54 * fVar45;
          pfVar40[4] = fVar55 * fVar45;
          pfVar40[5] = fVar56 * fVar45;
          pfVar40[6] = fVar57 * fVar45;
          pfVar40[7] = fVar58;
        }
        return 0;
      }
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Pooling_x86_avx2[-3]) != 0) {
        return 0;
      }
      if (iVar24 < 1) {
        iVar24 = 0;
      }
      if ((int)uVar16 < 1) {
        uVar19 = 0;
      }
      for (uVar43 = 0; uVar43 != uVar19; uVar43 = uVar43 + 1) {
        Mat::channel(&m,bottom_blob,(int)uVar43);
        pauVar37 = (undefined1 (*) [32])m.data;
        Mat::~Mat(&m);
        auVar2 = *pauVar37;
        iVar15 = iVar24;
        while (bVar44 = iVar15 != 0, iVar15 = iVar15 + -1, bVar44) {
          auVar2 = vmaxps_avx(auVar2,*pauVar37);
          pauVar37 = pauVar37 + 1;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar43 * 0x20) = auVar2;
      }
      return 0;
    }
    bottom_blob_bordered_1.cstep = 0;
    bottom_blob_bordered_1.data = (void *)0x0;
    bottom_blob_bordered_1.refcount._0_4_ = 0;
    bottom_blob_bordered_1.refcount._4_4_ = 0;
    bottom_blob_bordered_1._16_12_ = SUB1612(ZEXT816(0),4);
    bottom_blob_bordered_1._32_12_ = SUB1612(ZEXT816(0),0);
    bottom_blob_bordered_1.h = 0;
    bottom_blob_bordered_1.d = 0;
    bottom_blob_bordered_1.c = 0;
    bottom_blob_bordered_1.w = bottom_blob_bordered_1.refcount._4_4_;
    Pooling::make_padding(this_00,bottom_blob,&bottom_blob_bordered_1,opt);
    iVar22 = bottom_blob_bordered_1.h;
    iVar24 = bottom_blob_bordered_1.w;
    iVar15 = -100;
    if ((bottom_blob_bordered_1.data != (void *)0x0) &&
       ((long)bottom_blob_bordered_1.c * bottom_blob_bordered_1.cstep != 0)) {
      p_Var17 = this->_vptr_Pooling_x86_avx2[-3];
      iVar39 = (bottom_blob_bordered_1.w - *(int *)(&this->field_0xd4 + (long)p_Var17)) /
               *(int *)(&this->field_0xdc + (long)p_Var17);
      iVar28 = (bottom_blob_bordered_1.h - *(int *)(&this->field_0xd8 + (long)p_Var17)) /
               *(int *)(&this->field_0xe0 + (long)p_Var17);
      iVar26 = iVar39 + 1;
      Mat::create(top_blob,iVar26,iVar28 + 1,uVar16,_elemsize,8,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar43 = (long)*(int *)(&this->field_0xd8 + (long)this->_vptr_Pooling_x86_avx2[-3]) *
                 (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Pooling_x86_avx2[-3]);
        std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar43,(allocator_type *)&m);
        pp_Var4 = this->_vptr_Pooling_x86_avx2;
        p_Var17 = pp_Var4[-3];
        iVar15 = *(int *)(&this->field_0xd4 + (long)p_Var17);
        iVar30 = 0;
        lVar31 = 0;
        for (iVar27 = 0; iVar33 = *(int *)(&this->field_0xd8 + (long)p_Var17), iVar27 < iVar33;
            iVar27 = iVar27 + 1) {
          for (lVar34 = 0; iVar33 = (int)lVar34,
              iVar33 < *(int *)(&this->field_0xd4 + (long)p_Var17); lVar34 = lVar34 + 1) {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar31 + lVar34] = iVar30 + iVar33;
            p_Var17 = pp_Var4[-3];
          }
          iVar30 = iVar30 + (iVar24 - iVar15) + iVar33;
          lVar31 = (int)lVar31 + lVar34;
        }
        lVar31 = (long)iVar39;
        iVar15 = (int)uVar43;
        if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 0) {
          if (iVar33 == 2 && *(int *)(&this->field_0xd4 + (long)p_Var17) == 2) {
            if ((*(int *)(&this->field_0xdc + (long)p_Var17) == 2) &&
               (*(int *)(&this->field_0xe0 + (long)p_Var17) == 2)) {
              iVar15 = top_blob->w;
              iVar24 = bottom_blob_bordered_1.w - iVar15;
              iVar22 = 0;
              if (iVar15 < 1) {
                iVar15 = iVar22;
              }
              iVar39 = top_blob->h;
              if (top_blob->h < 1) {
                iVar39 = iVar22;
              }
              iVar28 = bottom_blob_bordered_1.c;
              if (bottom_blob_bordered_1.c < 1) {
                iVar28 = iVar22;
              }
              for (; iVar22 != iVar28; iVar22 = iVar22 + 1) {
                Mat::channel(&m,&bottom_blob_bordered_1,iVar22);
                Mat::channel(&bottom_blob_bordered,top_blob,iVar22);
                pvVar36 = bottom_blob_bordered.data;
                Mat::~Mat(&bottom_blob_bordered);
                pvVar20 = (void *)((long)m.w * m.elemsize + (long)m.data);
                pvVar18 = m.data;
                for (iVar26 = 0; iVar26 != iVar39; iVar26 = iVar26 + 1) {
                  lVar34 = 0;
                  lVar31 = (long)(iVar24 * 0x10) * -4;
                  iVar27 = iVar15;
                  while (bVar44 = iVar27 != 0, iVar27 = iVar27 + -1, bVar44) {
                    auVar2 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar18 + lVar34 * 2),
                                        *(undefined1 (*) [32])((long)pvVar18 + lVar34 * 2 + 0x20));
                    auVar8 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar34 * 2),
                                        *(undefined1 (*) [32])((long)pvVar20 + lVar34 * 2 + 0x20));
                    auVar2 = vmaxps_avx(auVar2,auVar8);
                    *(undefined1 (*) [32])((long)pvVar36 + lVar34) = auVar2;
                    lVar31 = lVar31 + -0x40;
                    lVar34 = lVar34 + 0x20;
                  }
                  pvVar18 = (void *)((long)pvVar18 - lVar31);
                  pvVar20 = (void *)((long)pvVar20 - lVar31);
                  pvVar36 = (void *)((long)pvVar36 + lVar34);
                }
                Mat::~Mat(&m);
              }
            }
            else {
LAB_001d6918:
              uVar32 = 0;
              uVar43 = uVar43 & 0xffffffff;
              if (iVar15 < 1) {
                uVar43 = uVar32;
              }
              if ((int)uVar16 < 1) {
                uVar19 = uVar32;
              }
              while( true ) {
                local_188 = (int)uVar19;
                iVar15 = (int)uVar32;
                if (iVar15 == local_188) break;
                Mat::channel(&m,&bottom_blob_bordered_1,iVar15);
                Mat::channel(&bottom_blob_bordered,top_blob,iVar15);
                pvVar36 = bottom_blob_bordered.data;
                Mat::~Mat(&bottom_blob_bordered);
                for (iVar24 = 0; iVar24 <= iVar28; iVar24 = iVar24 + 1) {
                  pp_Var4 = this->_vptr_Pooling_x86_avx2;
                  for (lVar34 = 0; lVar34 <= lVar31; lVar34 = lVar34 + 1) {
                    pauVar37 = (undefined1 (*) [32])
                               ((long)m.data +
                               (long)(*(int *)(&this->field_0xdc + (long)pp_Var4[-3]) * (int)lVar34
                                     * 8) * 4 +
                               (long)m.w * (long)iVar24 *
                               (long)*(int *)(&this->field_0xe0 + (long)pp_Var4[-3]) * m.elemsize);
                    auVar2 = *pauVar37;
                    for (uVar32 = 0; uVar43 != uVar32; uVar32 = uVar32 + 1) {
                      auVar2 = vmaxps_avx(auVar2,pauVar37[_space_ofs.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar32]])
                      ;
                    }
                    *(undefined1 (*) [32])((long)pvVar36 + lVar34 * 0x20) = auVar2;
                  }
                  pvVar36 = (void *)((long)pvVar36 + (long)(iVar26 * 8) * 4);
                }
                Mat::~Mat(&m);
                uVar32 = (ulong)(iVar15 + 1);
              }
            }
          }
          else {
            if (((iVar33 != 3 || *(int *)(&this->field_0xd4 + (long)p_Var17) != 3) ||
                (*(int *)(&this->field_0xdc + (long)p_Var17) != 2)) ||
               (*(int *)(&this->field_0xe0 + (long)p_Var17) != 2)) goto LAB_001d6918;
            iVar15 = top_blob->w;
            iVar24 = top_blob->h;
            iVar22 = 0;
            if (iVar24 < 1) {
              iVar24 = 0;
            }
            iVar39 = bottom_blob_bordered_1.c;
            if (bottom_blob_bordered_1.c < 1) {
              iVar39 = 0;
            }
            lVar31 = (long)((bottom_blob_bordered_1.w - iVar15) * 0x10) * 4;
            for (; iVar22 != iVar39; iVar22 = iVar22 + 1) {
              Mat::channel(&m,&bottom_blob_bordered_1,iVar22);
              Mat::channel(&bottom_blob_bordered,top_blob,iVar22);
              pauVar37 = (undefined1 (*) [32])bottom_blob_bordered.data;
              Mat::~Mat(&bottom_blob_bordered);
              pvVar36 = (void *)((long)m.data + (long)m.w * m.elemsize);
              pvVar18 = (void *)((long)m.data + (long)m.w * m.elemsize * 2);
              pvVar20 = m.data;
              for (iVar28 = 0; iVar28 != iVar24; iVar28 = iVar28 + 1) {
                lVar34 = 0;
                for (iVar26 = 0; iVar26 + 3 < iVar15; iVar26 = iVar26 + 4) {
                  auVar2 = *(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x40);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x80);
                  auVar9 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar34),
                                      *(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x20));
                  auVar9 = vmaxps_avx(auVar9,auVar2);
                  auVar9 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar36 + lVar34));
                  auVar10 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x20))
                  ;
                  auVar9 = *(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x40);
                  auVar3 = *(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x80);
                  auVar11 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar18 + lVar34));
                  auVar12 = vmaxps_avx(auVar11,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x20)
                                      );
                  auVar13 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x60))
                  ;
                  auVar11 = *(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x40);
                  auVar13 = vmaxps_avx(auVar13,auVar2);
                  auVar2 = *(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x80);
                  auVar12 = vmaxps_avx(auVar12,auVar11);
                  auVar13 = vmaxps_avx(auVar13,*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x60)
                                      );
                  auVar9 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x60));
                  auVar10 = vmaxps_avx(auVar10,auVar12);
                  *pauVar37 = auVar10;
                  auVar10 = vmaxps_avx(auVar3,auVar2);
                  auVar11 = vmaxps_avx(auVar10,auVar11);
                  auVar9 = vmaxps_avx(auVar11,auVar9);
                  auVar12 = vmaxps_avx(auVar13,auVar9);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0xc0);
                  auVar11 = *(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0xc0);
                  auVar10 = *(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0xc0);
                  auVar13 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0xa0))
                  ;
                  auVar8 = vmaxps_avx(auVar13,auVar8);
                  auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0xa0));
                  auVar3 = vmaxps_avx(auVar3,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0xa0));
                  pauVar37[1] = auVar12;
                  auVar12 = vmaxps_avx(auVar11,auVar10);
                  auVar2 = vmaxps_avx(auVar12,auVar2);
                  auVar2 = vmaxps_avx(auVar2,auVar3);
                  auVar3 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0xe0),
                                      *(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x100));
                  auVar9 = vmaxps_avx(auVar3,auVar9);
                  auVar9 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0xe0));
                  auVar9 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x100))
                  ;
                  auVar3 = vmaxps_avx(auVar11,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0xe0))
                  ;
                  auVar9 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x100))
                  ;
                  auVar2 = vmaxps_avx(auVar8,auVar2);
                  pauVar37[2] = auVar2;
                  auVar2 = vmaxps_avx(auVar10,auVar3);
                  auVar2 = vmaxps_avx(auVar9,auVar2);
                  pauVar37[3] = auVar2;
                  pauVar37 = pauVar37 + 4;
                  lVar34 = lVar34 + 0x100;
                }
                for (; iVar26 + 1 < iVar15; iVar26 = iVar26 + 2) {
                  auVar2 = *(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x40);
                  auVar8 = *(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x40);
                  auVar9 = *(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x40);
                  auVar3 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar34),
                                      *(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x20));
                  auVar3 = vmaxps_avx(auVar3,auVar9);
                  auVar3 = vmaxps_avx(auVar3,*(undefined1 (*) [32])((long)pvVar36 + lVar34));
                  auVar3 = vmaxps_avx(auVar3,*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x20));
                  auVar11 = vmaxps_avx(auVar2,*(undefined1 (*) [32])((long)pvVar18 + lVar34));
                  auVar11 = vmaxps_avx(auVar11,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x20)
                                      );
                  auVar11 = vmaxps_avx(auVar11,auVar8);
                  auVar10 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x60),
                                       *(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x80));
                  auVar9 = vmaxps_avx(auVar10,auVar9);
                  auVar9 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x60));
                  auVar9 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x80));
                  auVar2 = vmaxps_avx(auVar2,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x60));
                  auVar9 = vmaxps_avx(auVar9,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x80));
                  auVar3 = vmaxps_avx(auVar3,auVar11);
                  *pauVar37 = auVar3;
                  auVar2 = vmaxps_avx(auVar8,auVar2);
                  auVar2 = vmaxps_avx(auVar9,auVar2);
                  pauVar37[1] = auVar2;
                  pauVar37 = pauVar37 + 2;
                  lVar34 = lVar34 + 0x80;
                }
                for (; iVar26 < iVar15; iVar26 = iVar26 + 1) {
                  auVar2 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar20 + lVar34),
                                      *(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x20));
                  auVar2 = vmaxps_avx(auVar2,*(undefined1 (*) [32])((long)pvVar20 + lVar34 + 0x40));
                  auVar2 = vmaxps_avx(auVar2,*(undefined1 (*) [32])((long)pvVar36 + lVar34));
                  auVar2 = vmaxps_avx(auVar2,*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x20));
                  auVar8 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar36 + lVar34 + 0x40),
                                      *(undefined1 (*) [32])((long)pvVar18 + lVar34));
                  auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x20));
                  auVar8 = vmaxps_avx(auVar8,*(undefined1 (*) [32])((long)pvVar18 + lVar34 + 0x40));
                  auVar2 = vmaxps_avx(auVar2,auVar8);
                  *pauVar37 = auVar2;
                  pauVar37 = pauVar37 + 1;
                  lVar34 = lVar34 + 0x40;
                }
                pvVar20 = (void *)((long)pvVar20 + lVar34 + lVar31);
                pvVar36 = (void *)((long)pvVar36 + lVar34 + lVar31);
                pvVar18 = (void *)((long)pvVar18 + lVar34 + lVar31);
              }
              Mat::~Mat(&m);
            }
          }
        }
        else if (*(int *)(&this->field_0xd0 + (long)p_Var17) == 1) {
          if (*(int *)(&this->field_0xfc + (long)p_Var17) == 0) {
            iVar15 = 0;
            iVar39 = 0;
            if (*(int *)(&this->field_0xf8 + (long)p_Var17) == 0) {
              iVar39 = (bottom_blob->w - bottom_blob_bordered_1.w) +
                       *(int *)(&this->field_0xe4 + (long)p_Var17) +
                       *(int *)(&this->field_0xe8 + (long)p_Var17);
              iVar15 = (bottom_blob->h - bottom_blob_bordered_1.h) +
                       *(int *)(&this->field_0xec + (long)p_Var17) +
                       *(int *)(&this->field_0xf0 + (long)p_Var17);
            }
            if ((int)uVar16 < 1) {
              uVar16 = 0;
            }
            for (uVar41 = 0; uVar41 != uVar16; uVar41 = uVar41 + 1) {
              Mat::channel(&m,&bottom_blob_bordered_1,uVar41);
              Mat::channel(&bottom_blob_bordered,top_blob,uVar41);
              local_170 = bottom_blob_bordered.data;
              Mat::~Mat(&bottom_blob_bordered);
              pp_Var4 = this->_vptr_Pooling_x86_avx2;
              for (iVar27 = 0; iVar27 <= iVar28; iVar27 = iVar27 + 1) {
                lVar34 = (long)(*(int *)(&this->field_0xe0 + (long)pp_Var4[-3]) * iVar27);
                for (lVar29 = 0; lVar29 <= lVar31; lVar29 = lVar29 + 1) {
                  p_Var17 = pp_Var4[-3];
                  uVar43 = 0;
                  uVar19 = (ulong)*(uint *)(&this->field_0xd8 + (long)p_Var17);
                  if ((int)*(uint *)(&this->field_0xd8 + (long)p_Var17) < 1) {
                    uVar19 = uVar43;
                  }
                  lVar25 = (long)(*(int *)(&this->field_0xdc + (long)p_Var17) * (int)lVar29);
                  lVar35 = lVar25 * 0x20 + (long)m.w * m.elemsize * lVar34 + (long)m.data;
                  auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
                  iVar30 = 0;
                  for (; uVar43 != uVar19; uVar43 = uVar43 + 1) {
                    lVar21 = uVar43 + lVar34;
                    if (*(int *)(&this->field_0xec + (long)p_Var17) <= lVar21) {
                      if ((iVar15 + iVar22) - *(int *)(&this->field_0xf0 + (long)p_Var17) <= lVar21)
                      break;
                      uVar14 = *(uint *)(&this->field_0xd4 + (long)p_Var17);
                      if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var17) < 1) {
                        uVar14 = 0;
                      }
                      lVar21 = lVar25;
                      for (lVar42 = 0; (ulong)uVar14 * 0x20 != lVar42; lVar42 = lVar42 + 0x20) {
                        if (*(int *)(&this->field_0xe4 + (long)p_Var17) <= lVar21) {
                          if ((iVar39 + iVar24) - *(int *)(&this->field_0xe8 + (long)p_Var17) <=
                              lVar21) break;
                          pfVar40 = (float *)(lVar35 + lVar42);
                          auVar49 = ZEXT3264(CONCAT428(auVar49._28_4_ + pfVar40[7],
                                                       CONCAT424(auVar49._24_4_ + pfVar40[6],
                                                                 CONCAT420(auVar49._20_4_ +
                                                                           pfVar40[5],
                                                                           CONCAT416(auVar49._16_4_
                                                                                     + pfVar40[4],
                                                                                     CONCAT412(
                                                  auVar49._12_4_ + pfVar40[3],
                                                  CONCAT48(auVar49._8_4_ + pfVar40[2],
                                                           CONCAT44(auVar49._4_4_ + pfVar40[1],
                                                                    auVar49._0_4_ + *pfVar40))))))))
                          ;
                          iVar30 = iVar30 + 1;
                        }
                        lVar21 = lVar21 + 1;
                      }
                    }
                    lVar35 = lVar35 + (long)m.w * m.elemsize;
                  }
                  fVar45 = 1.0 / (float)iVar30;
                  auVar51._0_4_ = fVar45 * auVar49._0_4_;
                  auVar51._4_4_ = fVar45 * auVar49._4_4_;
                  auVar51._8_4_ = fVar45 * auVar49._8_4_;
                  auVar51._12_4_ = fVar45 * auVar49._12_4_;
                  auVar51._16_4_ = fVar45 * auVar49._16_4_;
                  auVar51._20_4_ = fVar45 * auVar49._20_4_;
                  auVar51._28_36_ = auVar49._28_36_;
                  auVar51._24_4_ = fVar45 * auVar49._24_4_;
                  *(undefined1 (*) [32])((long)local_170 + lVar29 * 0x20) = auVar51._0_32_;
                }
                local_170 = (void *)((long)local_170 + (long)(iVar26 * 8) * 4);
              }
              Mat::~Mat(&m);
            }
          }
          else {
            fVar45 = 1.0 / (float)iVar15;
            uVar32 = 0;
            uVar43 = uVar43 & 0xffffffff;
            if (iVar15 < 1) {
              uVar43 = uVar32;
            }
            if ((int)uVar16 < 1) {
              uVar19 = uVar32;
            }
            while( true ) {
              local_188 = (int)uVar19;
              iVar15 = (int)uVar32;
              if (iVar15 == local_188) break;
              Mat::channel(&m,&bottom_blob_bordered_1,iVar15);
              Mat::channel(&bottom_blob_bordered,top_blob,iVar15);
              pvVar36 = bottom_blob_bordered.data;
              Mat::~Mat(&bottom_blob_bordered);
              for (iVar24 = 0; iVar24 <= iVar28; iVar24 = iVar24 + 1) {
                pp_Var4 = this->_vptr_Pooling_x86_avx2;
                for (lVar34 = 0; lVar34 <= lVar31; lVar34 = lVar34 + 1) {
                  auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
                  uVar32 = 0;
                  while( true ) {
                    auVar50._28_36_ = auVar49._28_36_;
                    if (uVar43 == uVar32) break;
                    pfVar40 = (float *)((long)m.data +
                                       (long)_space_ofs.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[uVar32] * 0x20 +
                                       (long)(*(int *)(&this->field_0xdc + (long)pp_Var4[-3]) *
                                              (int)lVar34 * 8) * 4 +
                                       (long)m.w * (long)iVar24 *
                                       (long)*(int *)(&this->field_0xe0 + (long)pp_Var4[-3]) *
                                       m.elemsize);
                    auVar49 = ZEXT3264(CONCAT428(auVar49._28_4_ + pfVar40[7],
                                                 CONCAT424(auVar49._24_4_ + pfVar40[6],
                                                           CONCAT420(auVar49._20_4_ + pfVar40[5],
                                                                     CONCAT416(auVar49._16_4_ +
                                                                               pfVar40[4],
                                                                               CONCAT412(auVar49.
                                                  _12_4_ + pfVar40[3],
                                                  CONCAT48(auVar49._8_4_ + pfVar40[2],
                                                           CONCAT44(auVar49._4_4_ + pfVar40[1],
                                                                    auVar49._0_4_ + *pfVar40))))))))
                    ;
                    uVar32 = uVar32 + 1;
                  }
                  auVar50._0_4_ = auVar49._0_4_ * fVar45;
                  auVar50._4_4_ = auVar49._4_4_ * fVar45;
                  auVar50._8_4_ = auVar49._8_4_ * fVar45;
                  auVar50._12_4_ = auVar49._12_4_ * fVar45;
                  auVar50._16_4_ = auVar49._16_4_ * fVar45;
                  auVar50._20_4_ = auVar49._20_4_ * fVar45;
                  auVar50._24_4_ = auVar49._24_4_ * fVar45;
                  *(undefined1 (*) [32])((long)pvVar36 + lVar34 * 0x20) = auVar50._0_32_;
                }
                pvVar36 = (void *)((long)pvVar36 + (long)(iVar26 * 8) * 4);
              }
              Mat::~Mat(&m);
              uVar32 = (ulong)(iVar15 + 1);
            }
          }
        }
        goto LAB_001d7242;
      }
    }
  }
  this_01 = &bottom_blob_bordered_1;
LAB_001d7262:
  Mat::~Mat(this_01);
  return iVar15;
}

Assistant:

int Pooling_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    if (adaptive_pooling)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __SSE2__
    int elempack = bottom_blob.elempack;
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
#if __AVX__

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (elempack == 8)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _max = _mm256_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _max = _mm256_max_ps(_max, _val);
                        ptr += 8;
                    }

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m256 _sum = _mm256_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m256 _val = _mm256_loadu_ps(ptr);
                        _sum = _mm256_add_ps(_sum, _val);
                        ptr += 8;
                    }

                    __m256 _inv_size = _mm256_set1_ps(1.f / size);
                    __m256 _avg = _mm256_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm256_storeu_ps(outptr + q * 8, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack8_avx(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                        __m256 _max = _mm256_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                            _max = _mm256_max_ps(_max, _val);
                        }

                        _mm256_storeu_ps(outptr + j * 8, _max);
                    }

                    outptr += outw * 8;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m256 _sum = _mm256_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m256 _val = _mm256_loadu_ps(m.row(sy) + sx * 8);
                                    _sum = _mm256_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m256 _inv_area = _mm256_set1_ps(1.f / area);
                            __m256 _avg = _mm256_mul_ps(_sum, _inv_area);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m256 _inv_maxk = _mm256_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            __m256 _sum = _mm256_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                _sum = _mm256_add_ps(_sum, _val);
                            }

                            __m256 _avg = _mm256_mul_ps(_sum, _inv_maxk);
                            _mm256_storeu_ps(outptr + j * 8, _avg);
                        }

                        outptr += outw * 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (global_pooling)
        {
            top_blob.create(channels, elemsize, elempack, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * h;

            if (pooling_type == PoolMethod_MAX)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _max = _mm_loadu_ps(ptr);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _max = _mm_max_ps(_max, _val);
                        ptr += 4;
                    }

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _max);
                }
            }
            else if (pooling_type == PoolMethod_AVE)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);

                    __m128 _sum = _mm_set1_ps(0.f);
                    for (int i = 0; i < size; i++)
                    {
                        __m128 _val = _mm_loadu_ps(ptr);
                        _sum = _mm_add_ps(_sum, _val);
                        ptr += 4;
                    }

                    __m128 _inv_size = _mm_set1_ps(1.f / size);
                    __m128 _avg = _mm_mul_ps(_sum, _inv_size);

                    float* outptr = top_blob;
                    _mm_storeu_ps(outptr + q * 4, _avg);
                }
            }

            return 0;
        }

        Mat bottom_blob_bordered;
        make_padding(bottom_blob, bottom_blob_bordered, opt);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;

        int outw = (w - kernel_w) / stride_w + 1;
        int outh = (h - kernel_h) / stride_h + 1;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int maxk = kernel_w * kernel_h;

        // kernel offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - kernel_w;
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }
        if (pooling_type == PoolMethod_MAX)
        {
            if (kernel_w == 2 && kernel_h == 2 && stride_w == 2 && stride_h == 2)
            {
                pooling2x2s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 2 && stride_h == 2)
            {
                pooling3x3s2_max_pack4_sse(bottom_blob_bordered, top_blob, opt);

                return 0;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                        __m128 _max = _mm_loadu_ps(sptr);

                        for (int k = 0; k < maxk; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                            _max = _mm_max_ps(_max, _val);
                        }

                        _mm_storeu_ps(outptr + j * 4, _max);
                    }

                    outptr += outw * 4;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            if (avgpool_count_include_pad == 0)
            {
                int wtailpad = 0;
                int htailpad = 0;

                if (pad_mode == 0) // full padding
                {
                    wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                    htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            __m128 _sum = _mm_set1_ps(0.f);
                            int area = 0;

                            for (int ki = 0; ki < kernel_h; ki++)
                            {
                                int sy = sy0 + ki;

                                if (sy < pad_top)
                                    continue;

                                if (sy >= h - pad_bottom - htailpad)
                                    break;

                                for (int kj = 0; kj < kernel_w; kj++)
                                {
                                    int sx = sx0 + kj;

                                    if (sx < pad_left)
                                        continue;

                                    if (sx >= w - pad_right - wtailpad)
                                        break;

                                    __m128 _val = _mm_loadu_ps(m.row(sy) + sx * 4);
                                    _sum = _mm_add_ps(_sum, _val);
                                    area += 1;
                                }
                            }

                            __m128 _inv_area = _mm_set1_ps(1.f / area);
                            __m128 _avg = _mm_mul_ps(_sum, _inv_area);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
            else // if (avgpool_count_include_pad == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    float* outptr = top_blob.channel(q);

                    __m128 _inv_maxk = _mm_set1_ps(1.f / maxk);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            __m128 _sum = _mm_set1_ps(0.f);

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                _sum = _mm_add_ps(_sum, _val);
                            }

                            __m128 _avg = _mm_mul_ps(_sum, _inv_maxk);
                            _mm_storeu_ps(outptr + j * 4, _avg);
                        }

                        outptr += outw * 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    const int stride = stride_w;

    if (pooling_type != PoolMethod_MAX || stride != 2 || global_pooling == 1)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

#if __AVX__
    const int kernel_size = kernel_w;

    if (kernel_size != 2)
    {
        return Pooling::forward(bottom_blob, top_blob, opt);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (kernel_size == 2)
        pooling2x2s2_max_avx(bottom_blob_bordered, top_blob, opt);

    return 0;
#else
    return Pooling::forward(bottom_blob, top_blob, opt);
#endif
}